

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

Curl_dns_entry * fetch_addr(Curl_easy *data,char *hostname,int port)

{
  uchar uVar1;
  Curl_addrinfo *pCVar2;
  size_t sVar3;
  Curl_dns_entry *pCVar4;
  size_t in_RCX;
  Curl_dns_entry *pCVar5;
  hostcache_prune_data *data_1;
  char *fmt;
  Curl_dns_entry *c;
  hostcache_prune_data user;
  char entry_id [262];
  long local_140;
  char local_138 [272];
  
  create_hostcache_id(hostname,port,local_138,in_RCX);
  sVar3 = strlen(local_138);
  pCVar4 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,local_138,sVar3 + 1);
  if (pCVar4 == (Curl_dns_entry *)0x0) {
    if (((data->state).field_0x6d2 & 8) != 0) {
      create_hostcache_id("*",port,local_138,in_RCX);
      sVar3 = strlen(local_138);
      pCVar4 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,local_138,sVar3 + 1);
      if (pCVar4 != (Curl_dns_entry *)0x0) goto LAB_0044d44f;
    }
    pCVar4 = (Curl_dns_entry *)0x0;
  }
  else {
LAB_0044d44f:
    if ((data->set).dns_cache_timeout != -1) {
      time(&local_140);
      if ((pCVar4->timestamp != 0) &&
         ((long)(data->set).dns_cache_timeout <= local_140 - pCVar4->timestamp)) {
        fmt = "Hostname in DNS cache was stale, zapped";
LAB_0044d51f:
        Curl_infof(data,fmt);
        Curl_hash_delete((data->dns).hostcache,local_138,sVar3 + 1);
        return (Curl_dns_entry *)0x0;
      }
    }
    uVar1 = data->conn->ip_version;
    if (uVar1 != '\0') {
      pCVar5 = pCVar4;
      do {
        pCVar2 = pCVar5->addr;
        if (pCVar2 == (Curl_addrinfo *)0x0) {
          fmt = "Hostname in DNS cache doesn\'t have needed family, zapped";
          goto LAB_0044d51f;
        }
        pCVar5 = (Curl_dns_entry *)&pCVar2->ai_next;
      } while (pCVar2->ai_family != (uint)(uVar1 == '\x02') * 8 + 2);
    }
  }
  return pCVar4;
}

Assistant:

static struct Curl_dns_entry *fetch_addr(struct Curl_easy *data,
                                         const char *hostname,
                                         int port)
{
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->state.wildcard_resolve) {
    create_hostcache_id("*", port, entry_id, sizeof(entry_id));
    entry_len = strlen(entry_id);

    /* See if it's already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    time(&user.now);
    user.cache_timeout = data->set.dns_cache_timeout;

    if(hostcache_timestamp_remove(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* See if the returned entry matches the required resolve mode */
  if(dns && data->conn->ip_version != CURL_IPRESOLVE_WHATEVER) {
    int pf = PF_INET;
    bool found = false;
    struct Curl_addrinfo *addr = dns->addr;

#ifdef PF_INET6
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
#endif

    while(addr) {
      if(addr->ai_family == pf) {
        found = true;
        break;
      }
      addr = addr->ai_next;
    }

    if(!found) {
      infof(data, "Hostname in DNS cache doesn't have needed family, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }
  return dns;
}